

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_change_cipher_spec(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  undefined1 local_1c;
  undefined2 local_1b;
  undefined1 local_19;
  
  iVar1 = 0;
  if ((tls->field_0x1e8 & 4) != 0) {
    if (emitter->begin_message == begin_record_message) {
      local_1b = 0x314;
      local_19 = 3;
      iVar1 = ptls_buffer__do_pushv(emitter->buf,&local_1b,3);
      if ((iVar1 == 0) && (iVar1 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar1 == 0)) {
        sVar4 = emitter->buf->off;
        local_1c = 1;
        iVar1 = ptls_buffer__do_pushv(emitter->buf,&local_1c,1);
        if (iVar1 == 0) {
          uVar3 = emitter->buf->off - sVar4;
          iVar1 = 0x20c;
          if (uVar3 < 0x10000) {
            for (lVar2 = 8; lVar2 != -8; lVar2 = lVar2 + -8) {
              emitter->buf->base[sVar4 - 2] = (uint8_t)(uVar3 >> ((byte)lVar2 & 0x3f));
              sVar4 = sVar4 + 1;
            }
            tls->field_0x1e8 = tls->field_0x1e8 & 0xfb;
            iVar1 = 0;
          }
        }
      }
    }
    else {
      iVar1 = 10;
    }
  }
  return iVar1;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    /* check if we are requested to (or still need to) */
    if (!tls->send_change_cipher_spec) {
        ret = 0;
        goto Exit;
    }

    /* CCS is a record, can only be sent when using a record-based protocol. */
    if (emitter->begin_message != begin_record_message) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* emit CCS */
    buffer_push_record(emitter->buf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(emitter->buf, 1); });

    tls->send_change_cipher_spec = 0;
    ret = 0;
Exit:
    return ret;
}